

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  __m128i *ptr;
  __m128i *palVar22;
  __m128i *b;
  __m128i *palVar23;
  __m128i *palVar24;
  __m128i *ptr_00;
  __m128i *palVar25;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  int64_t *ptr_03;
  long lVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  int iVar30;
  ulong uVar31;
  size_t len;
  size_t len_00;
  long lVar32;
  uint uVar33;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  ulong size;
  ulong uVar40;
  undefined4 uVar41;
  ulong uVar42;
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar59;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar60;
  int64_t iVar61;
  undefined1 auVar63 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined4 uVar68;
  undefined1 auVar70 [12];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 uVar74;
  undefined1 auVar76 [12];
  undefined1 auVar77 [16];
  __m128i_64_t B_3;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i_64_t B_2;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i_64_t B_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  long lVar93;
  __m128i_64_t B;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  long lVar98;
  __m128i_64_t B_4;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  __m128i_64_t A_2;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  __m128i_64_t A;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  __m128i alVar108;
  __m128i alVar109;
  __m128i alVar110;
  __m128i alVar111;
  __m128i c;
  __m128i c_00;
  __m128i *local_190;
  __m128i *local_168;
  undefined8 uStack_160;
  __m128i *local_118;
  __m128i *local_108;
  undefined8 uStack_100;
  ulong uStack_70;
  ulong uStack_60;
  longlong extraout_RDX;
  longlong lVar43;
  longlong lVar62;
  longlong lVar69;
  longlong lVar75;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar33 = profile->s1Len;
        if ((int)uVar33 < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_1();
        }
        else {
          uVar35 = uVar33 - 1;
          size = (ulong)uVar33 + 1 >> 1;
          uVar8 = (ulong)uVar35 % size;
          pvVar6 = (profile->profile64).matches;
          pvVar7 = (profile->profile64).similar;
          uVar31 = (ulong)(uint)open;
          iVar38 = -open;
          iVar19 = ppVar5->min;
          uVar40 = 0x8000000000000000 - (long)iVar19;
          if (iVar19 != iVar38 && SBORROW4(iVar19,iVar38) == iVar19 + open < 0) {
            uVar40 = uVar31 | 0x8000000000000000;
          }
          iVar19 = ppVar5->max;
          ppVar21 = parasail_result_new_rowcol3((uint)((ulong)uVar33 + 1) & 0x7ffffffe,s2Len);
          if (ppVar21 != (parasail_result_t *)0x0) {
            ppVar21->flag = ppVar21->flag | 0x2850801;
            ptr = parasail_memalign___m128i(0x10,size);
            palVar22 = parasail_memalign___m128i(0x10,size);
            uStack_160 = local_168;
            local_168 = palVar22;
            b = parasail_memalign___m128i(0x10,size);
            palVar23 = parasail_memalign___m128i(0x10,size);
            uStack_100 = local_108;
            local_108 = palVar23;
            palVar24 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            palVar25 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            b_01 = parasail_memalign___m128i(0x10,size);
            b_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
            alVar108[1]._1_7_ = (undefined7)((ulong)palVar23 >> 8);
            alVar108[1]._0_1_ = b_01 == (__m128i *)0x0;
            auVar45._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar45._8_8_ = -(ulong)(palVar22 == (__m128i *)0x0);
            auVar71._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar71._8_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
            auVar45 = packssdw(auVar45,auVar71);
            auVar104._0_8_ = -(ulong)(palVar24 == (__m128i *)0x0);
            auVar104._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
            auVar82._0_8_ = -(ulong)(palVar25 == (__m128i *)0x0);
            auVar82._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
            auVar71 = packssdw(auVar104,auVar82);
            auVar45 = packssdw(auVar45,auVar71);
            if (((((b_00 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0) && b_01 != (__m128i *)0x0)
                 && b_02 != (__m128i *)0x0) && ptr_03 != (int64_t *)0x0) &&
                ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar45 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar45 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar45 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar45 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar45 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar45 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar45 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar45 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar45 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar45 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar45 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar45[0xf])) {
              iVar18 = s2Len + -1;
              uVar42 = (ulong)(uint)gap;
              lVar26 = uVar40 + 1;
              len = 0x7ffffffffffffffe - (long)iVar19;
              auVar46._8_4_ = (int)lVar26;
              auVar46._0_8_ = lVar26;
              auVar46._12_4_ = (int)((ulong)lVar26 >> 0x20);
              uVar59 = (undefined4)(len >> 0x20);
              auVar96._8_4_ = (int)len;
              auVar96._0_8_ = len;
              auVar96._12_4_ = uVar59;
              alVar108[0] = size;
              len_00 = len;
              parasail_memset___m128i(b,alVar108,len);
              alVar109[1] = extraout_RDX;
              alVar109[0] = size;
              parasail_memset___m128i(palVar24,alVar109,len_00);
              alVar110[1] = extraout_RDX_00;
              alVar110[0] = size;
              parasail_memset___m128i(palVar25,alVar110,len_00);
              alVar111[1] = extraout_RDX_01;
              alVar111[0] = size;
              parasail_memset___m128i(b_00,alVar111,len_00);
              c[1] = extraout_RDX_02;
              c[0] = size;
              parasail_memset___m128i(b_01,c,len_00);
              pmovsxbq(extraout_XMM0,0x101);
              c_00[1] = extraout_RDX_03;
              c_00[0] = size;
              parasail_memset___m128i(b_02,c_00,len_00);
              uVar36 = (ulong)(uint)gap;
              lVar34 = (long)iVar38;
              lVar27 = size << 4;
              lVar39 = 0;
              lVar26 = lVar34;
              do {
                auVar87._8_8_ = -(size * uVar36) + lVar26;
                auVar87._0_8_ = lVar26;
                *(undefined1 (*) [16])((long)*ptr + lVar39) = auVar87;
                plVar1 = (long *)((long)*ptr_02 + lVar39);
                *plVar1 = lVar26 - uVar31;
                plVar1[1] = (-(size * uVar36) - uVar31) + lVar26;
                lVar26 = lVar26 - uVar36;
                lVar39 = lVar39 + 0x10;
              } while (lVar27 != lVar39);
              *ptr_03 = 0;
              auVar45 = _DAT_00906ca0;
              lVar26 = (ulong)(uint)s2Len - 1;
              auVar47._8_4_ = (int)lVar26;
              auVar47._0_8_ = lVar26;
              auVar47._12_4_ = (int)((ulong)lVar26 >> 0x20);
              uVar28 = 0;
              auVar71 = pmovsxbq(auVar87,0x100);
              auVar47 = auVar47 ^ _DAT_00906ca0;
              do {
                if ((bool)(~(auVar47._0_8_ < (long)(uVar28 ^ auVar45._0_8_)) & 1)) {
                  ptr_03[uVar28 + 1] = lVar34;
                }
                auVar88._8_4_ = (int)uVar28;
                auVar88._0_8_ = uVar28;
                auVar88._12_4_ = (int)(uVar28 >> 0x20);
                if ((long)((auVar88._8_8_ | auVar71._8_8_) ^ auVar45._8_8_) <= auVar47._8_8_) {
                  ptr_03[uVar28 + 2] = lVar34 - uVar36;
                }
                uVar28 = uVar28 + 2;
                lVar34 = lVar34 + uVar36 * -2;
              } while ((s2Len + 1U & 0xfffffffe) != uVar28);
              uVar33 = (int)size - 1;
              uVar36 = 0;
              iVar19 = (int)(uVar35 / size);
              auVar45 = auVar46;
              do {
                local_118 = ptr_01;
                local_190 = ptr_00;
                palVar23 = ptr;
                palVar22 = b;
                ptr_01 = palVar25;
                ptr_00 = palVar24;
                b = local_108;
                ptr = local_168;
                palVar24 = palVar23 + uVar33;
                lVar75 = palVar22[uVar33][0];
                lVar69 = ptr_00[uVar33][0];
                lVar62 = ptr_01[uVar33][0];
                palVar25 = palVar23 + uVar33;
                auVar89._8_4_ = (int)(*palVar25)[0];
                auVar89._0_8_ = (*palVar25)[0];
                auVar89._12_4_ = *(undefined4 *)((long)*palVar25 + 4);
                lVar34 = 0;
                lVar98 = 0;
                lVar39 = 0;
                iVar61 = ptr_03[uVar36];
                lVar26 = auVar89._8_8_;
                lVar32 = (long)ppVar5->mapper[(byte)s2[uVar36]] * (long)(int)size * 0x10;
                palVar25 = (__m128i *)((long)pvVar6 + lVar32);
                lVar37 = 0;
                auVar104 = ZEXT816(0);
                auVar85 = _DAT_009050f0;
                auVar91 = auVar46;
                auVar71 = ZEXT816(0);
                do {
                  auVar105 = auVar71;
                  auVar71 = *(undefined1 (*) [16])((long)*ptr_02 + lVar37);
                  plVar1 = (long *)((long)pvVar4 + lVar37 + lVar32);
                  auVar64._0_8_ = iVar61 + *plVar1;
                  auVar64._8_8_ = lVar26 + plVar1[1];
                  auVar100._0_8_ = -(ulong)(auVar71._0_8_ < auVar64._0_8_);
                  auVar100._8_8_ = -(ulong)(auVar71._8_8_ < auVar64._8_8_);
                  auVar87 = blendvpd(auVar71,auVar64,auVar100);
                  auVar82 = *(undefined1 (*) [16])((long)*b_02 + lVar37);
                  auVar72._0_8_ = -(ulong)(auVar91._0_8_ < auVar87._0_8_);
                  auVar72._8_8_ = -(ulong)(auVar91._8_8_ < auVar87._8_8_);
                  auVar106 = blendvpd(auVar91,auVar87,auVar72);
                  auVar87 = *(undefined1 (*) [16])((long)*b_00 + lVar37);
                  auVar47 = *(undefined1 (*) [16])((long)*b_01 + lVar37);
                  *(undefined1 (*) [16])((long)*local_168 + lVar37) = auVar106;
                  auVar88 = blendvpd(auVar104,auVar87,auVar72);
                  plVar1 = (long *)((long)*palVar25 + lVar37);
                  auVar78._0_8_ = lVar34 + *plVar1;
                  auVar78._8_8_ = lVar75 + plVar1[1];
                  lVar26 = auVar106._0_8_;
                  auVar65._0_8_ = -(ulong)(auVar64._0_8_ == lVar26);
                  lVar34 = auVar106._8_8_;
                  auVar65._8_8_ = -(ulong)(auVar64._8_8_ == lVar34);
                  auVar89 = blendvpd(auVar88,auVar78,auVar65);
                  *(undefined1 (*) [16])((long)*local_108 + lVar37) = auVar89;
                  auVar88 = blendvpd(auVar105,auVar47,auVar72);
                  plVar1 = (long *)((long)pvVar7 + lVar37 + lVar32);
                  auVar99._0_8_ = lVar98 + *plVar1;
                  auVar99._8_8_ = lVar69 + plVar1[1];
                  auVar88 = blendvpd(auVar88,auVar99,auVar65);
                  auVar100 = blendvpd(auVar85,auVar82,auVar72);
                  auVar95._0_8_ = lVar39 + 1;
                  auVar95._8_8_ = lVar62 + 1;
                  auVar101 = blendvpd(auVar100,auVar95,auVar65);
                  auVar48._0_8_ = -(ulong)(auVar96._0_8_ < lVar26);
                  auVar48._8_8_ = -(ulong)(auVar96._8_8_ < lVar34);
                  auVar96 = blendvpd(auVar106,auVar96,auVar48);
                  auVar49._0_8_ = -(ulong)(lVar26 < auVar45._0_8_);
                  auVar49._8_8_ = -(ulong)(lVar34 < auVar45._8_8_);
                  auVar45 = blendvpd(auVar106,auVar45,auVar49);
                  auVar106._0_8_ = -(ulong)(auVar89._0_8_ < auVar45._0_8_);
                  auVar106._8_8_ = -(ulong)(auVar89._8_8_ < auVar45._8_8_);
                  auVar45 = blendvpd(auVar89,auVar45,auVar106);
                  auVar50._0_8_ = -(ulong)(auVar88._0_8_ < auVar45._0_8_);
                  auVar50._8_8_ = -(ulong)(auVar88._8_8_ < auVar45._8_8_);
                  auVar45 = blendvpd(auVar88,auVar45,auVar50);
                  auVar51._0_8_ = -(ulong)(auVar101._0_8_ < auVar45._0_8_);
                  auVar51._8_8_ = -(ulong)(auVar101._8_8_ < auVar45._8_8_);
                  auVar45 = blendvpd(auVar101,auVar45,auVar51);
                  uStack_60 = (ulong)(uint)open;
                  auVar107._0_8_ = lVar26 - uVar31;
                  auVar107._8_8_ = lVar34 - uStack_60;
                  uStack_70 = (ulong)(uint)gap;
                  auVar94._0_8_ = auVar71._0_8_ - uVar42;
                  auVar94._8_8_ = auVar71._8_8_ - uStack_70;
                  auVar52._0_8_ = -(ulong)(auVar94._0_8_ < auVar107._0_8_);
                  auVar52._8_8_ = -(ulong)(auVar94._8_8_ < auVar107._8_8_);
                  auVar100 = blendvpd(auVar94,auVar107,auVar52);
                  auVar71 = blendvpd(auVar87,auVar89,auVar52);
                  *(undefined1 (*) [16])((long)*local_190 + lVar37) = auVar88;
                  auVar47 = blendvpd(auVar47,auVar88,auVar52);
                  *(undefined1 (*) [16])((long)*local_118 + lVar37) = auVar101;
                  auVar81._0_8_ = auVar82._0_8_ + 1;
                  auVar81._8_8_ = auVar82._8_8_ + 1;
                  auVar102._0_8_ = auVar101._0_8_ + 1;
                  auVar102._8_8_ = auVar101._8_8_ + 1;
                  auVar82 = blendvpd(auVar81,auVar102,auVar52);
                  auVar90._0_8_ = auVar91._0_8_ - uVar42;
                  auVar90._8_8_ = auVar91._8_8_ - uStack_70;
                  auVar101._0_8_ = -(ulong)(auVar90._0_8_ < auVar107._0_8_);
                  auVar101._8_8_ = -(ulong)(auVar90._8_8_ < auVar107._8_8_);
                  auVar91 = blendvpd(auVar90,auVar107,auVar101);
                  auVar104 = blendvpd(auVar104,auVar89,auVar101);
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar37) = auVar100;
                  *(undefined1 (*) [16])((long)*b_00 + lVar37) = auVar71;
                  *(undefined1 (*) [16])((long)*b_01 + lVar37) = auVar47;
                  auVar77._8_4_ = 0xffffffff;
                  auVar77._0_8_ = 0xffffffffffffffff;
                  auVar77._12_4_ = 0xffffffff;
                  *(undefined1 (*) [16])((long)*b_02 + lVar37) = auVar82;
                  auVar71 = blendvpd(auVar105,auVar88,auVar101);
                  auVar84._0_8_ = auVar85._0_8_ + 1;
                  auVar84._8_8_ = auVar85._8_8_ - auVar77._8_8_;
                  auVar85 = blendvpd(auVar84,auVar102,auVar101);
                  plVar1 = (long *)((long)*palVar23 + lVar37);
                  iVar61 = *plVar1;
                  lVar26 = plVar1[1];
                  plVar1 = (long *)((long)*palVar22 + lVar37);
                  lVar34 = *plVar1;
                  lVar75 = plVar1[1];
                  plVar1 = (long *)((long)*ptr_00 + lVar37);
                  lVar98 = *plVar1;
                  lVar69 = plVar1[1];
                  plVar1 = (long *)((long)*ptr_01 + lVar37);
                  lVar39 = *plVar1;
                  lVar62 = plVar1[1];
                  lVar37 = lVar37 + 0x10;
                } while (lVar27 != lVar37);
                uStack_100 = auVar87._8_8_;
                local_108 = palVar22;
                uStack_160 = auVar105._8_8_;
                local_168 = palVar23;
                bVar17 = true;
                do {
                  bVar29 = bVar17;
                  auVar66._8_4_ = (int)(*palVar24)[0];
                  auVar66._0_8_ = (*palVar24)[0];
                  auVar66._12_4_ = *(undefined4 *)((long)*palVar24 + 4);
                  auVar92._0_8_ = auVar91._0_8_;
                  auVar92._8_4_ = auVar91._0_4_;
                  auVar92._12_4_ = auVar91._4_4_;
                  auVar105._8_8_ = 0;
                  auVar105._0_8_ = auVar104._0_8_;
                  auVar104 = auVar105 << 0x40;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = auVar71._0_8_;
                  auVar71 = auVar9 << 0x40;
                  iVar61 = ptr_03[uVar36];
                  lVar26 = auVar66._8_8_;
                  auVar91._8_8_ = auVar92._8_8_;
                  auVar91._0_8_ = ptr_03[uVar36 + 1] - uVar31;
                  auVar86._0_8_ = auVar85._0_8_;
                  auVar86._8_4_ = auVar85._0_4_;
                  auVar86._12_4_ = auVar85._4_4_;
                  auVar85._8_8_ = auVar86._8_8_;
                  auVar85._0_8_ = 1;
                  lVar34 = 0;
                  do {
                    plVar1 = (long *)((long)pvVar4 + lVar34 + lVar32);
                    lVar39 = *plVar1;
                    lVar98 = plVar1[1];
                    auVar82 = *(undefined1 (*) [16])((long)*ptr + lVar34);
                    auVar53._0_8_ = -(ulong)(auVar91._0_8_ < auVar82._0_8_);
                    lVar93 = auVar91._8_8_;
                    auVar53._8_8_ = -(ulong)(lVar93 < auVar82._8_8_);
                    auVar82 = blendvpd(auVar91,auVar82,auVar53);
                    *(undefined1 (*) [16])((long)*ptr + lVar34) = auVar82;
                    lVar37 = auVar82._0_8_;
                    auVar67._0_8_ = -(ulong)(iVar61 + lVar39 == lVar37);
                    lVar39 = auVar82._8_8_;
                    auVar67._8_8_ = -(ulong)(lVar26 + lVar98 == lVar39);
                    auVar67 = auVar67 | auVar53;
                    auVar87 = blendvpd(auVar104,*(undefined1 (*) [16])((long)*b + lVar34),auVar67);
                    *(undefined1 (*) [16])((long)*b + lVar34) = auVar87;
                    auVar47 = blendvpd(auVar71,*(undefined1 (*) [16])((long)*local_190 + lVar34),
                                       auVar67);
                    *(undefined1 (*) [16])((long)*local_190 + lVar34) = auVar47;
                    auVar88 = blendvpd(auVar85,*(undefined1 (*) [16])((long)*local_118 + lVar34),
                                       auVar67);
                    auVar54._0_8_ = -(ulong)(auVar96._0_8_ < lVar37);
                    auVar54._8_8_ = -(ulong)(auVar96._8_8_ < lVar39);
                    auVar96 = blendvpd(auVar82,auVar96,auVar54);
                    auVar55._0_8_ = -(ulong)(lVar37 < auVar45._0_8_);
                    auVar55._8_8_ = -(ulong)(lVar39 < auVar45._8_8_);
                    auVar45 = blendvpd(auVar82,auVar45,auVar55);
                    auVar56._0_8_ = -(ulong)(auVar87._0_8_ < auVar45._0_8_);
                    auVar56._8_8_ = -(ulong)(auVar87._8_8_ < auVar45._8_8_);
                    auVar45 = blendvpd(auVar87,auVar45,auVar56);
                    auVar57._0_8_ = -(ulong)(auVar47._0_8_ < auVar45._0_8_);
                    auVar57._8_8_ = -(ulong)(auVar47._8_8_ < auVar45._8_8_);
                    auVar45 = blendvpd(auVar47,auVar45,auVar57);
                    *(undefined1 (*) [16])((long)*local_118 + lVar34) = auVar88;
                    auVar58._0_8_ = -(ulong)(auVar88._0_8_ < auVar45._0_8_);
                    auVar58._8_8_ = -(ulong)(auVar88._8_8_ < auVar45._8_8_);
                    auVar45 = blendvpd(auVar88,auVar45,auVar58);
                    auVar91._0_8_ = auVar91._0_8_ - uVar42;
                    auVar91._8_8_ = lVar93 - uStack_70;
                    auVar73._0_8_ = -(ulong)(auVar91._0_8_ < (long)(lVar37 - uVar31));
                    auVar73._8_8_ = -(ulong)(auVar91._8_8_ < (long)(lVar39 - uStack_60));
                    iVar38 = movmskpd((int)palVar25,auVar73);
                    if (iVar38 == 3) goto LAB_00737be7;
                    auVar104 = blendvpd(auVar104,auVar87,auVar73);
                    auVar71 = blendvpd(auVar71,auVar47,auVar73);
                    auVar82 = blendvpd(auVar85,auVar88,auVar73);
                    auVar85._0_8_ = auVar82._0_8_ + 1;
                    auVar85._8_8_ = auVar82._8_8_ - auVar77._8_8_;
                    plVar1 = (long *)((long)*palVar23 + lVar34);
                    iVar61 = *plVar1;
                    lVar26 = plVar1[1];
                    lVar34 = lVar34 + 0x10;
                    palVar25 = palVar23;
                  } while (lVar27 != lVar34);
                  bVar17 = false;
                } while (bVar29);
LAB_00737be7:
                lVar75 = ptr[uVar8][0];
                uVar74 = (undefined4)ptr[uVar8][1];
                lVar69 = b[uVar8][0];
                uVar68 = (undefined4)b[uVar8][1];
                lVar62 = local_190[uVar8][0];
                uVar60 = (undefined4)local_190[uVar8][1];
                lVar43 = local_118[uVar8][0];
                uVar41 = (undefined4)local_118[uVar8][1];
                if (iVar19 < 1) {
                  do {
                    uVar41 = (undefined4)lVar43;
                    uVar60 = (undefined4)lVar62;
                    uVar68 = (undefined4)lVar69;
                    uVar74 = (undefined4)lVar75;
                    lVar75 = 0;
                    lVar69 = 0;
                    lVar62 = 0;
                    lVar43 = 0;
                  } while (iVar19 < 0);
                }
                *(undefined4 *)(*((ppVar21->field_4).trace)->trace_del_table + uVar36 * 4) = uVar74;
                *(undefined4 *)
                 (*(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 8) + uVar36 * 4) =
                     uVar68;
                *(undefined4 *)
                 (*(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10) + uVar36 * 4)
                     = uVar60;
                *(undefined4 *)
                 (*(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18) + uVar36 * 4)
                     = uVar41;
                uVar36 = uVar36 + 1;
                palVar24 = local_190;
                palVar25 = local_118;
                if (uVar36 == (uint)s2Len) {
                  lVar27 = size * 4;
                  lVar26 = 0;
                  do {
                    puVar2 = (undefined4 *)((long)*ptr + lVar26 * 4);
                    uVar74 = puVar2[2];
                    puVar3 = (undefined4 *)((long)*b + lVar26 * 4);
                    uVar68 = *puVar3;
                    uVar60 = puVar3[2];
                    puVar3 = (undefined4 *)((long)*local_190 + lVar26 * 4);
                    uVar41 = *puVar3;
                    uVar13 = puVar3[2];
                    puVar3 = (undefined4 *)((long)*local_118 + lVar26 * 4);
                    uVar14 = *puVar3;
                    uVar15 = puVar3[2];
                    lVar34 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x20);
                    *(undefined4 *)(lVar34 + lVar26) = *puVar2;
                    *(undefined4 *)(lVar27 + lVar34 + lVar26) = uVar74;
                    lVar34 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x28);
                    *(undefined4 *)(lVar34 + lVar26) = uVar68;
                    *(undefined4 *)(lVar27 + lVar34 + lVar26) = uVar60;
                    lVar34 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x30);
                    *(undefined4 *)(lVar34 + lVar26) = uVar41;
                    *(undefined4 *)(lVar27 + lVar34 + lVar26) = uVar13;
                    lVar34 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x38);
                    *(undefined4 *)(lVar34 + lVar26) = uVar14;
                    *(undefined4 *)(lVar27 + lVar34 + lVar26) = uVar15;
                    lVar26 = lVar26 + 4;
                  } while (lVar27 != lVar26);
                  alVar108 = ptr[uVar8];
                  auVar76 = alVar108._0_12_;
                  alVar109 = b[uVar8];
                  auVar70 = alVar109._0_12_;
                  alVar110 = local_190[uVar8];
                  auVar63 = alVar110._0_12_;
                  alVar111 = local_118[uVar8];
                  auVar44 = alVar111._0_12_;
                  if (iVar19 < 1) {
                    do {
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = alVar108[0];
                      alVar108 = (__m128i)(auVar10 << 0x40);
                      auVar76 = alVar108._0_12_;
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = alVar109[0];
                      alVar109 = (__m128i)(auVar11 << 0x40);
                      auVar70 = alVar109._0_12_;
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = alVar110[0];
                      alVar110 = (__m128i)(auVar12 << 0x40);
                      auVar63 = alVar110._0_12_;
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ = alVar111[0];
                      alVar111 = (__m128i)(auVar16 << 0x40);
                      auVar44 = alVar111._0_12_;
                    } while (iVar19 < 0);
                  }
                  auVar79._8_4_ = (int)uVar40;
                  auVar79._0_8_ = uVar40;
                  auVar79._12_4_ = (int)(uVar40 >> 0x20);
                  auVar97._0_8_ = -(ulong)((long)uVar40 < auVar96._0_8_);
                  auVar97._8_8_ = -(ulong)(auVar79._8_8_ < auVar96._8_8_);
                  auVar80._8_4_ = 0xffffffff;
                  auVar80._0_8_ = 0xffffffffffffffff;
                  auVar80._12_4_ = 0xffffffff;
                  auVar83._8_4_ = (int)len;
                  auVar83._0_8_ = len;
                  auVar83._12_4_ = uVar59;
                  auVar103._0_8_ = -(ulong)((long)len < auVar45._0_8_);
                  auVar103._8_8_ = -(ulong)(auVar83._8_8_ < auVar45._8_8_);
                  iVar19 = movmskpd((int)uVar8 * 0x10,auVar103 | auVar80 ^ auVar97);
                  if (iVar19 == 0) {
                    iVar19 = auVar76._8_4_;
                    iVar38 = auVar70._8_4_;
                    iVar30 = auVar63._8_4_;
                    iVar20 = auVar44._8_4_;
                  }
                  else {
                    *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                    iVar19 = 0;
                    iVar38 = 0;
                    iVar30 = 0;
                    iVar20 = 0;
                    iVar18 = 0;
                    uVar35 = 0;
                  }
                  ppVar21->score = iVar19;
                  ppVar21->end_query = uVar35;
                  ppVar21->end_ref = iVar18;
                  ((ppVar21->field_4).stats)->matches = iVar38;
                  ((ppVar21->field_4).stats)->similar = iVar30;
                  ((ppVar21->field_4).stats)->length = iVar20;
                  parasail_free(ptr_03);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(b_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(local_118);
                  parasail_free(ptr_00);
                  parasail_free(local_190);
                  parasail_free(palVar22);
                  parasail_free(b);
                  parasail_free(palVar23);
                  parasail_free(ptr);
                  return ppVar21;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 8);
                vHM = _mm_slli_si128 (vHM, 8);
                vHS = _mm_slli_si128 (vHS, 8);
                vHL = _mm_slli_si128 (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
            vHM = _mm_slli_si128 (vHM, 8);
            vHS = _mm_slli_si128 (vHS, 8);
            vHL = _mm_slli_si128 (vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}